

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symmetric_matrix.cc
# Opt level: O2

bool __thiscall
sptk::SymmetricMatrix::CholeskyDecomposition
          (SymmetricMatrix *this,SymmetricMatrix *lower_triangular_matrix,
          vector<double,_std::allocator<double>_> *diagonal_elements)

{
  pointer ppdVar1;
  pointer ppdVar2;
  double *pdVar3;
  double *pdVar4;
  bool bVar5;
  int iVar6;
  pointer pdVar7;
  int j;
  long lVar8;
  size_type __new_size;
  int i;
  long lVar9;
  int j_1;
  int k;
  long lVar10;
  double dVar11;
  
  bVar5 = false;
  if (((this != lower_triangular_matrix) && (lower_triangular_matrix != (SymmetricMatrix *)0x0)) &&
     (bVar5 = false, diagonal_elements != (vector<double,_std::allocator<double>_> *)0x0)) {
    dVar11 = **(this->index_).super__Vector_base<double_*,_std::allocator<double_*>_>._M_impl.
               super__Vector_impl_data._M_start;
    if ((dVar11 != 0.0) || (NAN(dVar11))) {
      iVar6 = lower_triangular_matrix->num_dimension_;
      if (iVar6 != this->num_dimension_) {
        Resize(lower_triangular_matrix,this->num_dimension_);
        iVar6 = this->num_dimension_;
      }
      pdVar7 = (diagonal_elements->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
      __new_size = (size_type)iVar6;
      if ((long)(diagonal_elements->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_finish - (long)pdVar7 >> 3 != __new_size) {
        std::vector<double,_std::allocator<double>_>::resize(diagonal_elements,__new_size);
        pdVar7 = (diagonal_elements->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        __new_size = (size_type)this->num_dimension_;
      }
      ppdVar1 = (this->index_).super__Vector_base<double_*,_std::allocator<double_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      *pdVar7 = **ppdVar1;
      ppdVar2 = (lower_triangular_matrix->index_).
                super__Vector_base<double_*,_std::allocator<double_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      **ppdVar2 = 1.0;
      for (lVar9 = 1; lVar9 < (long)__new_size; lVar9 = lVar9 + 1) {
        pdVar3 = ppdVar1[lVar9];
        pdVar4 = ppdVar2[lVar9];
        for (lVar8 = 0; lVar8 != lVar9; lVar8 = lVar8 + 1) {
          dVar11 = pdVar3[lVar8];
          for (lVar10 = 0; lVar8 != lVar10; lVar10 = lVar10 + 1) {
            dVar11 = dVar11 - ppdVar2[lVar8][lVar10] * pdVar4[lVar10] * pdVar7[lVar10];
          }
          pdVar4[lVar8] = dVar11 / pdVar7[lVar8];
        }
        dVar11 = pdVar3[lVar9];
        pdVar7[lVar9] = dVar11;
        for (lVar8 = 0; lVar9 != lVar8; lVar8 = lVar8 + 1) {
          dVar11 = dVar11 - pdVar4[lVar8] * pdVar4[lVar8] * pdVar7[lVar8];
          pdVar7[lVar9] = dVar11;
        }
        if (ABS(dVar11) <= 1e-12) {
          return (long)__new_size <= lVar9;
        }
        pdVar4[lVar9] = 1.0;
      }
      bVar5 = true;
    }
    else {
      bVar5 = false;
    }
  }
  return bVar5;
}

Assistant:

bool SymmetricMatrix::CholeskyDecomposition(
    SymmetricMatrix* lower_triangular_matrix,
    std::vector<double>* diagonal_elements) const {
  if (NULL == lower_triangular_matrix || NULL == diagonal_elements ||
      this == lower_triangular_matrix || 0.0 == index_[0][0]) {
    return false;
  }

  if (lower_triangular_matrix->num_dimension_ != num_dimension_) {
    lower_triangular_matrix->Resize(num_dimension_);
  }
  if (diagonal_elements->size() != static_cast<std::size_t>(num_dimension_)) {
    diagonal_elements->resize(num_dimension_);
  }

  double* d(&((*diagonal_elements)[0]));

  d[0] = index_[0][0];
  lower_triangular_matrix->index_[0][0] = 1.0;
  for (int i(1); i < num_dimension_; ++i) {
    for (int j(0); j < i; ++j) {
      double tmp(index_[i][j]);
      for (int k(0); k < j; ++k) {
        tmp -= lower_triangular_matrix->index_[i][k] *
               lower_triangular_matrix->index_[j][k] * d[k];
      }
      lower_triangular_matrix->index_[i][j] = tmp / d[j];
    }

    d[i] = index_[i][i];
    for (int j(0); j < i; ++j) {
      d[i] -= lower_triangular_matrix->index_[i][j] *
              lower_triangular_matrix->index_[i][j] * d[j];
    }
    if (std::fabs(d[i]) <= kMinimumValueOfDiagonalElement) {
      return false;
    }
    lower_triangular_matrix->index_[i][i] = 1.0;
  }
  return true;
}